

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O0

bool __thiscall cmParseCacheCoverage::ReadCMCovFile(cmParseCacheCoverage *this,char *file)

{
  pointer *line_00;
  cmCTest *pcVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  mapped_type *this_00;
  reference pvVar10;
  value_type_conflict1 local_fbc;
  string local_fb8 [32];
  undefined1 local_f98 [8];
  ostringstream cmCTestLog_msg_7;
  int count;
  size_type linenumber;
  SingleFileCoverageVector *coverageVector;
  string local_de8 [32];
  undefined1 local_dc8 [8];
  ostringstream cmCTestLog_msg_6;
  string local_c50 [32];
  undefined1 local_c30 [8];
  ostringstream cmCTestLog_msg_5;
  string local_ab8 [32];
  undefined1 local_a98 [8];
  ostringstream cmCTestLog_msg_4;
  ulong local_920;
  size_type i;
  undefined1 local_8f8 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_780 [8];
  string filepath;
  string routine;
  undefined1 local_720 [8];
  ostringstream cmCTestLog_msg_2;
  string local_5a8 [32];
  undefined1 local_588 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_410 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  separateLine;
  string line;
  string local_3d0 [32];
  undefined1 local_3b0 [8];
  ostringstream cmCTestLog_msg;
  long local_228;
  ifstream in;
  char *file_local;
  cmParseCacheCoverage *this_local;
  
  std::ifstream::ifstream(&local_228,file,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar2 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    poVar5 = std::operator<<((ostream *)local_3b0,"Can not open : ");
    poVar5 = std::operator<<(poVar5,file);
    std::operator<<(poVar5,"\n");
    pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x73,pcVar6,false);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    this_local._7_1_ = false;
    goto LAB_00510d5e;
  }
  line_00 = &separateLine.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)line_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_410);
  bVar3 = cmsys::SystemTools::GetLineFromStream
                    ((istream *)&local_228,(string *)line_00,(bool *)0x0,-1);
  if (bVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_410);
    SplitString(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_410,
                (string *)
                &separateLine.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_410);
    if (sVar7 == 4) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_410,0);
      bVar3 = std::operator!=(pvVar8,"Routine");
      if (bVar3) goto LAB_005101dc;
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_410,1);
      bVar3 = std::operator!=(pvVar8,"Line");
      if (bVar3) goto LAB_005101dc;
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_410,2);
      bVar3 = std::operator!=(pvVar8,"RtnLine");
      if (bVar3) goto LAB_005101dc;
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_410,3);
      bVar3 = std::operator!=(pvVar8,"Code");
      if (bVar3) goto LAB_005101dc;
    }
    else {
LAB_005101dc:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
      poVar5 = std::operator<<((ostream *)local_720,"Bad first line of cmcov file : ");
      poVar5 = std::operator<<(poVar5,file);
      poVar5 = std::operator<<(poVar5,"  line:\n[");
      poVar5 = std::operator<<(poVar5,(string *)
                                      &separateLine.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar5,"]\n");
      pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                   ,0x89,pcVar6,false);
      std::__cxx11::string::~string((string *)(routine.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
    }
    std::__cxx11::string::string((string *)(filepath.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_780);
    while (bVar3 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_228,
                              (string *)
                              &separateLine.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)0x0,-1),
          bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_410);
      SplitString(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_410,
                  (string *)
                  &separateLine.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_410);
      if (sVar7 < 4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8f8);
        poVar5 = std::operator<<((ostream *)local_8f8,
                                 "Bad line of cmcov file expected at least 4 found: ");
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_410);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,file);
        poVar5 = std::operator<<(poVar5,"  line:\n[");
        poVar5 = std::operator<<(poVar5,(string *)
                                        &separateLine.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator<<(poVar5,"]\n");
        pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0x9b,pcVar6,false);
        std::__cxx11::string::~string((string *)&i);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8f8);
        for (local_920 = 0;
            sVar7 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_410), local_920 < sVar7; local_920 = local_920 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a98);
          poVar5 = std::operator<<((ostream *)local_a98,"");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_410,1);
          poVar5 = std::operator<<(poVar5,(string *)pvVar8);
          std::operator<<(poVar5," ");
          pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                       ,0x9f,pcVar6,false);
          std::__cxx11::string::~string(local_ab8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a98);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c30);
        std::operator<<((ostream *)local_c30,"\n");
        pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0xa1,pcVar6,false);
        std::__cxx11::string::~string(local_c50);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c30);
        this_local._7_1_ = false;
        goto LAB_00510cf6;
      }
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_410,0);
        std::__cxx11::string::substr((ulong)&coverageVector,(ulong)pvVar8);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&coverageVector,"Totals");
        std::__cxx11::string::~string((string *)&coverageVector);
        if (bVar3) {
          std::__cxx11::string::operator=((string *)(filepath.field_2._M_local_buf + 8),"");
          std::__cxx11::string::operator=((string *)local_780,"");
        }
        else {
LAB_00510a06:
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage,
                                   (key_type *)local_780);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_410,1);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            iVar4 = atoi(pcVar6);
            uVar9 = (ulong)(iVar4 + -1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_410,2);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            iVar4 = atoi(pcVar6);
            sVar7 = std::vector<int,_std::allocator<int>_>::size(this_00);
            if (sVar7 < uVar9) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f98);
              poVar5 = std::operator<<((ostream *)local_f98,
                                       "Parse error line is greater than number of lines in file: ")
              ;
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar9);
              poVar5 = std::operator<<(poVar5," ");
              poVar5 = std::operator<<(poVar5,(string *)local_780);
              std::operator<<(poVar5,"\n");
              pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,6,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                           ,0xcf,pcVar6,false);
              std::__cxx11::string::~string(local_fb8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f98);
            }
            else {
              while (sVar7 = std::vector<int,_std::allocator<int>_>::size(this_00), sVar7 <= uVar9)
              {
                local_fbc = -1;
                std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_fbc);
              }
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,uVar9);
              if ((*pvVar10 == -1) && (0 < iVar4)) {
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,uVar9);
                *pvVar10 = iVar4 + 1 + *pvVar10;
              }
              else {
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,uVar9);
                *pvVar10 = iVar4 + *pvVar10;
              }
            }
          }
        }
      }
      else {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_410,0);
        std::__cxx11::string::operator=
                  ((string *)(filepath.field_2._M_local_buf + 8),(string *)pvVar8);
        bVar3 = cmParseMumpsCoverage::FindMumpsFile
                          (&this->super_cmParseMumpsCoverage,(string *)((long)&filepath.field_2 + 8)
                           ,(string *)local_780);
        if (bVar3) goto LAB_00510a06;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_dc8);
        poVar5 = std::operator<<((ostream *)local_dc8,"Could not find mumps file for routine: ");
        poVar5 = std::operator<<(poVar5,(string *)(filepath.field_2._M_local_buf + 8));
        std::operator<<(poVar5,"\n");
        pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0xae,pcVar6,false);
        std::__cxx11::string::~string(local_de8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_dc8);
        std::__cxx11::string::operator=((string *)local_780,"");
      }
    }
    this_local._7_1_ = true;
LAB_00510cf6:
    std::__cxx11::string::~string((string *)local_780);
    std::__cxx11::string::~string((string *)(filepath.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
    poVar5 = std::operator<<((ostream *)local_588,"Empty file : ");
    poVar5 = std::operator<<(poVar5,file);
    poVar5 = std::operator<<(poVar5,"  referenced in this line of cmcov data:\n[");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &separateLine.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar5,"]\n");
    pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x7d,pcVar6,false);
    std::__cxx11::string::~string(local_5a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
    this_local._7_1_ = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_410);
  std::__cxx11::string::~string
            ((string *)
             &separateLine.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00510d5e:
  std::ifstream::~ifstream(&local_228);
  return this_local._7_1_;
}

Assistant:

bool cmParseCacheCoverage::ReadCMCovFile(const char* file)
{
  cmsys::ifstream in(file);
  if(!in)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Can not open : "
               << file << "\n");
    return false;
    }
  std::string line;
  std::vector<std::string> separateLine;
  if(!cmSystemTools::GetLineFromStream(in, line))
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Empty file : "
               << file << "  referenced in this line of cmcov data:\n"
               "[" << line << "]\n");
    return false;
    }
  separateLine.clear();
  this->SplitString(separateLine, line);
  if(separateLine.size() !=4 || separateLine[0] != "Routine"
     || separateLine[1] != "Line" || separateLine[2] != "RtnLine"
     || separateLine[3] != "Code")
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Bad first line of cmcov file : "
               << file << "  line:\n"
               "[" << line << "]\n");
    }
  std::string routine;
  std::string filepath;
  while(cmSystemTools::GetLineFromStream(in, line))
    {
    // clear out line argument vector
    separateLine.clear();
    // parse the comma separated line
    this->SplitString(separateLine, line);
    // might have more because code could have a quoted , in it
    // but we only care about the first 3 args anyway
    if(separateLine.size() < 4)
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Bad line of cmcov file expected at least 4 found: "
                 << separateLine.size() << " "
                 << file << "  line:\n"
                 "[" << line << "]\n");
      for(std::string::size_type i = 0; i < separateLine.size(); ++i)
        {
        cmCTestLog(this->CTest, ERROR_MESSAGE,""
                   << separateLine[1] << " ");
        }
      cmCTestLog(this->CTest, ERROR_MESSAGE, "\n");
      return false;
      }
    // if we do not have a routine yet, then it should be
    // the first argument in the vector
    if(routine.empty())
      {
      routine = separateLine[0];
      // Find the full path to the file
      if(!this->FindMumpsFile(routine, filepath))
        {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Could not find mumps file for routine: "
                   << routine << "\n");
        filepath = "";
        continue; // move to next line
        }
      }
    // if we have a routine name, check for end of routine
    else
      {
      // Totals in arg 0 marks the end of a routine
      if(separateLine[0].substr(0, 6) == "Totals")
        {
        routine = ""; // at the end of this routine
        filepath = "";
        continue; // move to next line
        }
      }
    // if the file path was not found for the routine
    // move to next line. We should have already warned
    // after the call to FindMumpsFile that we did not find
    // it, so don't report again to cut down on output
    if(filepath.empty())
      {
      continue;
      }
    // now we are ready to set the coverage from the line of data
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector&
      coverageVector = this->Coverage.TotalCoverage[filepath];
    std::string::size_type linenumber = atoi(separateLine[1].c_str()) -1;
    int count = atoi(separateLine[2].c_str());
    if(linenumber > coverageVector.size())
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Parse error line is greater than number of lines in file: "
                 << linenumber << " " << filepath << "\n");
      continue; // skip setting count to avoid crash
      }
    // now add to count for linenumber
    // for some reason the cache coverage adds extra lines to the
    // end of the file in some cases. Since they do not exist, we will
    // mark them as non executable
    while(linenumber >= coverageVector.size())
      {
      coverageVector.push_back(-1);
      }
    // Accounts for lines that were previously marked
    // as non-executable code (-1). if the parser comes back with
    // a non-zero count, increase the count by 1 to push the line
    // into the executable code set in addition to the count found.
    if(coverageVector[linenumber] == -1 &&
        count > 0)
      {
        coverageVector[linenumber] += count+1;
      }
    else
      {
        coverageVector[linenumber] += count;
      }
    }
  return true;
}